

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdOpts.cpp
# Opt level: O1

int __thiscall CmdOpts::parse(CmdOpts *this)

{
  ArgHas AVar1;
  uint uVar2;
  char **ppcVar3;
  string *psVar4;
  char *pcVar5;
  char ****ppppcVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  char ******ppppppcVar12;
  long lVar13;
  ulong uVar14;
  Option *pOVar15;
  char ******ppppppcVar16;
  char acStack_50 [8];
  char *****local_48;
  char ****local_40;
  int local_34;
  
  uVar14 = (ulong)(this->_numOpts + 1);
  lVar13 = uVar14 * -0x20;
  ppppppcVar16 = &local_48 + uVar14 * -4;
  pcVar10 = (char *)((long)ppppppcVar16 -
                    ((ulong)(this->_numOpts * 3 + 1) + 0xf & 0xfffffffffffffff0));
  local_34 = 0;
  iVar7 = this->_numOpts;
  pcVar8 = pcVar10;
  local_40 = (char ****)pcVar10;
  if (0 < iVar7) {
    do {
      pOVar15 = this->_opts;
      *pOVar15[local_34].present = false;
      *pcVar8 = pOVar15[local_34].letter;
      pOVar15 = this->_opts;
      lVar11 = (long)local_34;
      ppppppcVar12 = ppppppcVar16 + lVar11 * 4 + 1;
      ppppppcVar16[lVar11 * 4] = (char *****)pOVar15[lVar11].name;
      AVar1 = pOVar15[lVar11].arg.has;
      if (AVar1 == ArgOptional) {
        *(undefined4 *)ppppppcVar12 = 2;
        pcVar8[1] = ':';
        pcVar8[2] = ':';
        pcVar8 = pcVar8 + 3;
      }
      else if (AVar1 == ArgRequired) {
        *(undefined4 *)ppppppcVar12 = 1;
        pcVar8[1] = ':';
        pcVar8 = pcVar8 + 2;
      }
      else {
        pcVar8 = pcVar8 + 1;
        *(undefined4 *)ppppppcVar12 = 0;
      }
      iVar9 = local_34 + 1;
      *(undefined8 *)(&stack0xffffffffffffffc8 + (long)local_34 * 0x20 + lVar13) = 0;
      *(undefined4 *)(&stack0xffffffffffffffd0 + (long)local_34 * 0x20 + lVar13) = 0;
      iVar7 = this->_numOpts;
      local_34 = iVar9;
    } while (iVar9 < iVar7);
  }
  *(undefined8 *)(&stack0xffffffffffffffc8 + (long)iVar7 * 0x20 + lVar13) = 0;
  *(undefined8 *)((long)(&stack0xffffffffffffffc8 + (long)iVar7 * 0x20 + lVar13) + 8) = 0;
  ppppppcVar16[(long)iVar7 * 4] = (char *****)0x0;
  (ppppppcVar16 + (long)iVar7 * 4)[1] = (char *****)0x0;
  *pcVar8 = '\0';
  local_34 = 0;
  local_48 = (char *****)ppppppcVar16;
  do {
    ppppcVar6 = local_40;
    iVar7 = this->_argc;
    ppcVar3 = this->_argv;
    pcVar10[-8] = -0x75;
    pcVar10[-7] = -10;
    pcVar10[-6] = '\x10';
    pcVar10[-5] = '\0';
    pcVar10[-4] = '\0';
    pcVar10[-3] = '\0';
    pcVar10[-2] = '\0';
    pcVar10[-1] = '\0';
    iVar7 = getopt_long(iVar7,ppcVar3,ppppcVar6,ppppppcVar16,&local_34);
    if (iVar7 != 0) {
      if (iVar7 == -1) {
        return _optind;
      }
      if (iVar7 == 0x3f) {
        return -1;
      }
      uVar2 = this->_numOpts;
      if ((int)uVar2 < 1) {
        uVar14 = 0;
      }
      else {
        pOVar15 = this->_opts;
        uVar14 = 0;
        do {
          if (pOVar15->letter == (char)iVar7) goto LAB_0010f6c4;
          uVar14 = uVar14 + 1;
          pOVar15 = pOVar15 + 1;
        } while (uVar2 != uVar14);
        uVar14 = (ulong)uVar2;
      }
LAB_0010f6c4:
      local_34 = (int)uVar14;
    }
    lVar13 = (long)local_34;
    if ((lVar13 < 0) || (this->_numOpts <= local_34)) {
      pcVar10[-8] = -0x4b;
      pcVar10[-7] = -9;
      pcVar10[-6] = '\x10';
      pcVar10[-5] = '\0';
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      __assert_fail("optIdx >= 0 && optIdx < _numOpts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/CmdOpts.cpp"
                    ,0x81,"int CmdOpts::parse()");
    }
    pOVar15 = this->_opts;
    *pOVar15[lVar13].present = true;
    pcVar8 = _optarg;
    if (_optarg != (char *)0x0 && pOVar15[lVar13].arg.has != ArgNone) {
      if (pOVar15[lVar13].arg.type == ArgInt) {
        pcVar10[-8] = '_';
        pcVar10[-7] = -9;
        pcVar10[-6] = '\x10';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        lVar13 = strtol(_optarg,(char **)0x0,0);
        *this->_opts[local_34].arg.value.intPtr = (int)lVar13;
      }
      else {
        psVar4 = pOVar15[lVar13].arg.value.strPtr;
        pcVar5 = (char *)psVar4->_M_string_length;
        pcVar10[-8] = '-';
        pcVar10[-7] = -9;
        pcVar10[-6] = '\x10';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        strlen(_optarg);
        ppppppcVar16 = (char ******)local_48;
        pcVar10[-8] = 'N';
        pcVar10[-7] = -9;
        pcVar10[-6] = '\x10';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar5,(ulong)pcVar8);
      }
    }
  } while( true );
}

Assistant:

int
CmdOpts::parse()
{
    struct option long_opts[_numOpts + 1];
    char optstring[_numOpts * 3 + 1];
    char* optPtr = optstring;
    int optIdx;
    int rc;

    for (optIdx = 0; optIdx < _numOpts; optIdx++)
    {
        *_opts[optIdx].present = false;

        *optPtr++ = _opts[optIdx].letter;
        long_opts[optIdx].name = _opts[optIdx].name;
        switch (_opts[optIdx].arg.has)
        {
        default:
        case ArgNone:
            long_opts[optIdx].has_arg = no_argument;
            break;
        case ArgOptional:
            long_opts[optIdx].has_arg = optional_argument;
            *optPtr++ = ':';
            *optPtr++ = ':';
            break;
        case ArgRequired:
            long_opts[optIdx].has_arg = required_argument;
            *optPtr++ = ':';
            break;
        }
        long_opts[optIdx].flag = NULL;
        long_opts[optIdx].val = 0;
    }

    memset(&long_opts[_numOpts], 0, sizeof(long_opts[_numOpts]));
    *optPtr = '\0';
    optIdx = 0;
    while ((rc = getopt_long(_argc, _argv, optstring, long_opts, &optIdx)) != -1)
    {
        if (rc == '?')
            return -1;

        if (rc != 0)
           optIdx = find(rc);

        assert(optIdx >= 0 && optIdx < _numOpts);
        *_opts[optIdx].present = true;
        if (_opts[optIdx].arg.has != ArgNone && optarg)
        {
            switch (_opts[optIdx].arg.type)
            {
            case ArgInt:
                *_opts[optIdx].arg.value.intPtr = strtol(optarg, NULL, 0);
                break;
            default:
            case ArgString:
                *_opts[optIdx].arg.value.strPtr = optarg;
                break;
            }
        }
    }

    return optind;
}